

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O2

string * __thiscall
iutest::detail::StringFormat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *format,__va_list_tag *va)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *dst;
  int *piVar4;
  ulong size;
  va_list va2;
  __va_list_tag local_48;
  
  sVar3 = strlen((char *)this);
  local_48.reg_save_area = *(void **)(format + 0x10);
  local_48._0_8_ = *(undefined8 *)format;
  local_48.overflow_arg_area = *(void **)(format + 8);
  iVar1 = vsnprintf((char *)0x0,0,(char *)this,&local_48);
  size = (ulong)(iVar1 + 1);
  if (iVar1 < 1) {
    size = sVar3 * 2 + 1;
  }
  do {
    dst = (char *)operator_new__(size);
    local_48.reg_save_area = *(void **)(format + 0x10);
    local_48._0_8_ = *(undefined8 *)format;
    local_48.overflow_arg_area = *(void **)(format + 8);
    uVar2 = iu_vsnprintf(dst,size,(char *)this,&local_48);
    if ((int)uVar2 < 0) {
      piVar4 = __errno_location();
      if ((*piVar4 == 7) || (*piVar4 == 0x4b)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_48);
        return __return_storage_ptr__;
      }
    }
    else if (uVar2 < size) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,dst,dst + uVar2);
      operator_delete__(dst);
      return __return_storage_ptr__;
    }
    operator_delete__(dst);
    size = size * 2;
  } while( true );
}

Assistant:

inline ::std::string StringFormat(const char* format, va_list va)
{
    size_t n = strlen(format) * 2 + 1;
    {
        va_list va2;
        iu_va_copy(va2, va);    // cppcheck-suppress va_list_usedBeforeStarted
        const int ret = iu_vsnprintf(NULL, 0u, format, va2);
        va_end(va2);
        if( ret > 0 )
        {
            n = static_cast<size_t>(ret + 1);
        }
    }
    for( ;; )
    {
        char* dst = new char[n];
        va_list va2;
        iu_va_copy(va2, va);    // cppcheck-suppress va_list_usedBeforeStarted
        const int written = iu_vsnprintf(dst, n, format, va2);
        va_end(va2);
        if( written < 0 )
        {
#if defined(EOVERFLOW)
            if( errno == EOVERFLOW )
            {
                break;
            }
#endif
#if defined(E2BIG)
            if( errno == E2BIG )
            {
                break;
            }
#endif
        }
        else if( static_cast<size_t>(written) < n )
        {
            ::std::string s = ::std::string(dst, static_cast<size_t>(written));
            delete[] dst;
            return s;
        }
        delete[] dst;
        n *= 2;
    }
    return "";
}